

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O1

bool __thiscall
Js::PolymorphicCallSiteInfo::GetFunction
          (PolymorphicCallSiteInfo *this,uint index,LocalFunctionId *functionId,SourceId *sourceId)

{
  LocalFunctionId LVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (3 < index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3a4,"(index < DynamicProfileInfo::maxPolymorphicInliningSize)",
                                "index < DynamicProfileInfo::maxPolymorphicInliningSize");
    if (!bVar3) goto LAB_00978466;
    *puVar4 = 0;
  }
  if (functionId == (LocalFunctionId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3a5,"(functionId)","functionId");
    if (!bVar3) goto LAB_00978466;
    *puVar4 = 0;
  }
  if (sourceId == (SourceId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3a6,"(sourceId)","sourceId");
    if (!bVar3) {
LAB_00978466:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  LVar1 = this->functionIds[index];
  if (LVar1 != 0xfffffffc) {
    *functionId = LVar1;
    *sourceId = this->sourceIds[index];
  }
  return LVar1 != 0xfffffffc;
}

Assistant:

bool GetFunction(uint index, Js::LocalFunctionId *functionId, Js::SourceId *sourceId)
        {
            Assert(index < DynamicProfileInfo::maxPolymorphicInliningSize);
            Assert(functionId);
            Assert(sourceId);
            if (DynamicProfileInfo::IsCallSiteNoInfo(functionIds[index]))
            {
                return false;
            }
            *functionId = functionIds[index];
            *sourceId = sourceIds[index];
            return true;
        }